

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkLineDeviceComputer.cxx
# Opt level: O1

void __thiscall
cmLinkLineDeviceComputer::ComputeLinkLibraries
          (cmLinkLineDeviceComputer *this,cmComputeLinkInformation *cli,string *stdLibString,
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *linkLibraries)

{
  pointer pcVar1;
  cmGeneratorTarget *pcVar2;
  pointer pcVar3;
  pointer pcVar4;
  cmLinkLineComputer *this_00;
  TargetType TVar5;
  int iVar6;
  int iVar7;
  ItemVector *pIVar8;
  ulong uVar9;
  cmLinkImplementation *pcVar10;
  string *psVar11;
  pointer this_01;
  bool bVar12;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar13;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  basic_string_view<char,_std::char_traits<char>_> __str_01;
  basic_string_view<char,_std::char_traits<char>_> __str_02;
  basic_string_view<char,_std::char_traits<char>_> __str_03;
  basic_string_view<char,_std::char_traits<char>_> __str_04;
  string libPath;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> linkLib;
  string config;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emitted;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_178;
  ulong local_148;
  string local_140;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *local_d0;
  cmConstStack<cmListFileContext,_cmListFileBacktrace> local_c8;
  cmLinkLineComputer *local_b8;
  string *local_b0;
  pointer local_a8;
  long *local_a0 [2];
  long local_90 [2];
  string local_80;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_d0 = (vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
             linkLibraries;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  pIVar8 = cmComputeLinkInformation::GetItems(cli);
  local_a0[0] = local_90;
  pcVar1 = (cli->Config)._M_dataplus._M_p;
  local_b8 = &this->super_cmLinkLineComputer;
  local_b0 = stdLibString;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_a0,pcVar1,pcVar1 + (cli->Config)._M_string_length);
  this_01 = (pIVar8->
            super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_a8 = (pIVar8->
             super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  if (this_01 != local_a8) {
    uVar9 = 0;
    do {
      local_148 = uVar9;
      if ((uVar9 & 1) == 0) {
        if (this_01->Target == (cmGeneratorTarget *)0x0) goto LAB_004f79f3;
        TVar5 = cmGeneratorTarget::GetType(this_01->Target);
        if (1 < TVar5 - SHARED_LIBRARY) {
          if (TVar5 == STATIC_LIBRARY) {
            pcVar2 = this_01->Target;
            local_120.Value._M_dataplus._M_p = (pointer)&local_120.Value.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_120,"CUDA_RESOLVE_DEVICE_SYMBOLS","");
            bVar12 = cmGeneratorTarget::GetPropertyAsBool(pcVar2,&local_120.Value);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_120.Value._M_dataplus._M_p != &local_120.Value.field_2) {
              operator_delete(local_120.Value._M_dataplus._M_p,
                              local_120.Value.field_2._M_allocated_capacity + 1);
            }
            if (!bVar12) goto LAB_004f79f3;
          }
          else if (TVar5 != INTERFACE_LIBRARY) {
LAB_004f79f3:
            local_e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x0;
            local_e0._M_local_buf[0] = '\0';
            local_c8.TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)0x0;
            local_c8.TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_f0 = &local_e0;
            cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack(&local_c8);
            local_120.Value._M_dataplus._M_p = (pointer)&local_120.Value.field_2;
            if (local_f0 == &local_e0) {
              local_120.Value.field_2._8_8_ = local_e0._8_8_;
            }
            else {
              local_120.Value._M_dataplus._M_p = (pointer)local_f0;
            }
            local_120.Value.field_2._M_allocated_capacity._1_7_ =
                 local_e0._M_allocated_capacity._1_7_;
            local_120.Value.field_2._M_local_buf[0] = local_e0._M_local_buf[0];
            local_120.Value._M_string_length = (size_type)local_e8;
            local_e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x0;
            local_e0._M_local_buf[0] = '\0';
            local_120.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = local_c8.TopEntry.
                      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr;
            local_120.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi =
                 local_c8.TopEntry.
                 super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
            local_c8.TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)0x0;
            local_c8.TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            if (this_01->IsPath == Yes) {
              local_178.Value._M_string_length = (size_type)(this_01->Value).Value._M_dataplus._M_p;
              local_178.Value._M_dataplus._M_p = (pointer)(this_01->Value).Value._M_string_length;
              local_f0 = &local_e0;
              if ((local_178.Value._M_dataplus._M_p < &DAT_00000002) ||
                 (__str._M_str = ".a", __str._M_len = 2,
                 iVar6 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                                   ((basic_string_view<char,_std::char_traits<char>_> *)&local_178,
                                    (size_type)(local_178.Value._M_dataplus._M_p + -2),2,__str),
                 iVar6 != 0)) {
                local_178.Value._M_string_length =
                     (size_type)(this_01->Value).Value._M_dataplus._M_p;
                local_178.Value._M_dataplus._M_p = (pointer)(this_01->Value).Value._M_string_length;
                if ((local_178.Value._M_dataplus._M_p <
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x4) ||
                   (__str_00._M_str = ".lib", __str_00._M_len = 4,
                   iVar6 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                                     ((basic_string_view<char,_std::char_traits<char>_> *)&local_178
                                      ,(size_type)(local_178.Value._M_dataplus._M_p + -4),4,__str_00
                                     ), iVar6 != 0)) goto LAB_004f7cba;
              }
              this_00 = local_b8;
              (*local_b8->_vptr_cmLinkLineComputer[2])(&local_80,local_b8,this_01);
              cmLinkLineComputer::ConvertToOutputFormat(&local_140,this_00,&local_80);
              cmComputeLinkInformation::Item::GetFormattedItem(&local_178,this_01,&local_140);
              std::__cxx11::string::operator=((string *)&local_120,(string *)&local_178);
              if (local_178.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                  TopEntry.
                  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_178.Backtrace.
                           super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                           super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_178.Value._M_dataplus._M_p != &local_178.Value.field_2) {
                operator_delete(local_178.Value._M_dataplus._M_p,
                                local_178.Value.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_140._M_dataplus._M_p != &local_140.field_2) {
                operator_delete(local_140._M_dataplus._M_p,
                                local_140.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_80._M_dataplus._M_p != &local_80.field_2) {
                operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1
                               );
              }
LAB_004f7cba:
              pVar13 = std::
                       _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                       ::_M_insert_unique<std::__cxx11::string_const&>
                                 ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                   *)&local_60,&local_120.Value);
              if (((undefined1  [16])pVar13 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
                uVar9 = local_148 & 0xffffffff;
              }
              else {
                std::__cxx11::string::append((char *)&local_120);
                pcVar2 = cli->Target;
                local_178.Value._M_dataplus._M_p = (pointer)&local_178.Value.field_2;
                pcVar1 = (cli->Config)._M_dataplus._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_178,pcVar1,pcVar1 + (cli->Config)._M_string_length);
                pcVar10 = cmGeneratorTarget::GetLinkImplementation(pcVar2,&local_178.Value,Link);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_178.Value._M_dataplus._M_p != &local_178.Value.field_2) {
                  operator_delete(local_178.Value._M_dataplus._M_p,
                                  local_178.Value.field_2._M_allocated_capacity + 1);
                }
                pcVar3 = (pcVar10->super_cmLinkImplementationLibraries).Libraries.
                         super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl
                         .super__Vector_impl_data._M_finish;
                pcVar4 = (pcVar10->super_cmLinkImplementationLibraries).Libraries.
                         super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl
                         .super__Vector_impl_data._M_start;
                do {
                  if (pcVar4 == pcVar3) break;
                  pcVar2 = (pcVar4->super_cmLinkItem).Target;
                  if ((pcVar2 == (cmGeneratorTarget *)0x0) ||
                     (TVar5 = cmGeneratorTarget::GetType(pcVar2), TVar5 == INTERFACE_LIBRARY)) {
LAB_004f7e57:
                    iVar6 = 0;
                  }
                  else {
                    pcVar2 = (pcVar4->super_cmLinkItem).Target;
                    local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
                    pcVar1 = (cli->Config)._M_dataplus._M_p;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_140,pcVar1,pcVar1 + (cli->Config)._M_string_length);
                    psVar11 = cmGeneratorTarget::GetLocation(pcVar2,&local_140);
                    local_178.Value._M_dataplus._M_p = (pointer)&local_178.Value.field_2;
                    pcVar1 = (psVar11->_M_dataplus)._M_p;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_178,pcVar1,pcVar1 + psVar11->_M_string_length);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_140._M_dataplus._M_p != &local_140.field_2) {
                      operator_delete(local_140._M_dataplus._M_p,
                                      local_140.field_2._M_allocated_capacity + 1);
                    }
                    pcVar1 = (pointer)(this_01->Value).Value._M_string_length;
                    iVar6 = 0;
                    bVar12 = false;
                    if (pcVar1 == (pointer)local_178.Value._M_string_length) {
                      if (pcVar1 == (pointer)0x0) {
                        bVar12 = true;
                      }
                      else {
                        iVar7 = bcmp((this_01->Value).Value._M_dataplus._M_p,
                                     local_178.Value._M_dataplus._M_p,(size_t)pcVar1);
                        bVar12 = iVar7 == 0;
                      }
                    }
                    if (bVar12) {
                      local_120.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>
                      .TopEntry.
                      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr = (pcVar4->super_cmLinkItem).Backtrace.
                                super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr;
                      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                                (&local_120.Backtrace.
                                  super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                                  TopEntry.
                                  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount,
                                 &(pcVar4->super_cmLinkItem).Backtrace.
                                  super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                                  TopEntry.
                                  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount);
                      iVar6 = 5;
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_178.Value._M_dataplus._M_p != &local_178.Value.field_2) {
                      operator_delete(local_178.Value._M_dataplus._M_p,
                                      local_178.Value.field_2._M_allocated_capacity + 1);
                    }
                    if (!bVar12) goto LAB_004f7e57;
                  }
                  pcVar4 = pcVar4 + 1;
                } while (iVar6 == 0);
                std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
                emplace_back<BT<std::__cxx11::string>&>(local_d0,&local_120);
                uVar9 = local_148 & 0xffffffff;
              }
            }
            else {
              local_178.Value._M_dataplus._M_p = (pointer)&local_178.Value.field_2;
              local_f0 = &local_e0;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"-framework","");
              pcVar1 = (pointer)(this_01->Value).Value._M_string_length;
              if (pcVar1 == (pointer)local_178.Value._M_string_length) {
                if (pcVar1 == (pointer)0x0) {
                  bVar12 = true;
                }
                else {
                  iVar6 = bcmp((this_01->Value).Value._M_dataplus._M_p,
                               local_178.Value._M_dataplus._M_p,(size_t)pcVar1);
                  bVar12 = iVar6 == 0;
                }
              }
              else {
                bVar12 = false;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_178.Value._M_dataplus._M_p != &local_178.Value.field_2) {
                operator_delete(local_178.Value._M_dataplus._M_p,
                                local_178.Value.field_2._M_allocated_capacity + 1);
              }
              uVar9 = CONCAT71((int7)((ulong)&local_120 >> 8),1);
              if (!bVar12) {
                local_178.Value._M_string_length =
                     (size_type)(this_01->Value).Value._M_dataplus._M_p;
                local_178.Value._M_dataplus._M_p = (pointer)(this_01->Value).Value._M_string_length;
                __str_01._M_str = "-";
                __str_01._M_len = 1;
                iVar6 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                                  ((basic_string_view<char,_std::char_traits<char>_> *)&local_178,0,
                                   1,__str_01);
                if (iVar6 == 0) {
                  local_178.Value._M_string_length =
                       (size_type)(this_01->Value).Value._M_dataplus._M_p;
                  local_178.Value._M_dataplus._M_p =
                       (pointer)(this_01->Value).Value._M_string_length;
                  __str_02._M_str = "-l";
                  __str_02._M_len = 2;
                  iVar6 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                                    ((basic_string_view<char,_std::char_traits<char>_> *)&local_178,
                                     0,2,__str_02);
                  if (iVar6 != 0) {
                    local_178.Value._M_string_length =
                         (size_type)(this_01->Value).Value._M_dataplus._M_p;
                    local_178.Value._M_dataplus._M_p =
                         (pointer)(this_01->Value).Value._M_string_length;
                    __str_03._M_str = "-L";
                    __str_03._M_len = 2;
                    iVar6 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                                      ((basic_string_view<char,_std::char_traits<char>_> *)
                                       &local_178,0,2,__str_03);
                    if (iVar6 != 0) {
                      local_178.Value._M_string_length =
                           (size_type)(this_01->Value).Value._M_dataplus._M_p;
                      local_178.Value._M_dataplus._M_p =
                           (pointer)(this_01->Value).Value._M_string_length;
                      __str_04._M_str = "--library";
                      __str_04._M_len = 9;
                      iVar6 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                                        ((basic_string_view<char,_std::char_traits<char>_> *)
                                         &local_178,0,9,__str_04);
                      if (iVar6 != 0) goto LAB_004f7cba;
                    }
                  }
                }
                std::__cxx11::string::_M_assign((string *)&local_120);
                goto LAB_004f7cba;
              }
            }
            if (local_120.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_120.Backtrace.
                         super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                         super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_120.Value._M_dataplus._M_p != &local_120.Value.field_2) {
              operator_delete(local_120.Value._M_dataplus._M_p,
                              local_120.Value.field_2._M_allocated_capacity + 1);
            }
            goto LAB_004f7ecc;
          }
        }
        uVar9 = local_148 & 0xffffffff;
      }
      else {
        uVar9 = 0;
      }
LAB_004f7ecc:
      this_01 = this_01 + 1;
      uVar9 = uVar9 & 0xffffffff;
    } while (this_01 != local_a8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0->_M_string_length !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    local_178.Value._M_string_length = (size_type)(local_b0->_M_dataplus)._M_p;
    local_178.Value.field_2._8_8_ = &local_120.Value.field_2;
    local_120.Value._M_dataplus._M_p = &DAT_00000001;
    local_120.Value.field_2._M_local_buf[0] = 0x20;
    local_178.Value.field_2._M_allocated_capacity = 1;
    views._M_len = 2;
    views._M_array = (iterator)&local_178;
    local_178.Value._M_dataplus._M_p = (pointer)local_b0->_M_string_length;
    local_120.Value._M_string_length = local_178.Value.field_2._8_8_;
    cmCatViews_abi_cxx11_(&local_140,views);
    std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
    emplace_back<std::__cxx11::string>(local_d0,&local_140);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_a0[0] != local_90) {
    operator_delete(local_a0[0],local_90[0] + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void cmLinkLineDeviceComputer::ComputeLinkLibraries(
  cmComputeLinkInformation& cli, std::string const& stdLibString,
  std::vector<BT<std::string>>& linkLibraries)
{
  // Generate the unique set of link items when device linking.
  // The nvcc device linker is designed so that each static library
  // with device symbols only needs to be listed once as it doesn't
  // care about link order.
  std::set<std::string> emitted;
  using ItemVector = cmComputeLinkInformation::ItemVector;
  ItemVector const& items = cli.GetItems();
  std::string config = cli.GetConfig();
  bool skipItemAfterFramework = false;
  // Note:
  // Any modification of this algorithm should be reflected also in
  // cmVisualStudio10TargetGenerator::ComputeCudaLinkOptions
  for (auto const& item : items) {
    if (skipItemAfterFramework) {
      skipItemAfterFramework = false;
      continue;
    }

    if (item.Target) {
      bool skip = false;
      switch (item.Target->GetType()) {
        case cmStateEnums::SHARED_LIBRARY:
        case cmStateEnums::MODULE_LIBRARY:
        case cmStateEnums::INTERFACE_LIBRARY:
          skip = true;
          break;
        case cmStateEnums::STATIC_LIBRARY:
          skip = item.Target->GetPropertyAsBool("CUDA_RESOLVE_DEVICE_SYMBOLS");
          break;
        default:
          break;
      }
      if (skip) {
        continue;
      }
    }

    BT<std::string> linkLib;
    if (item.IsPath == cmComputeLinkInformation::ItemIsPath::Yes) {
      // nvcc understands absolute paths to libraries ending in '.a' or '.lib'.
      // These should be passed to nvlink.  Other extensions need to be left
      // out because nvlink may not understand or need them.  Even though it
      // can tolerate '.so' or '.dylib' it cannot tolerate '.so.1'.
      if (cmHasLiteralSuffix(item.Value.Value, ".a") ||
          cmHasLiteralSuffix(item.Value.Value, ".lib")) {
        linkLib.Value = item
                          .GetFormattedItem(this->ConvertToOutputFormat(
                            this->ConvertToLinkReference(item.Value.Value)))
                          .Value;
      }
    } else if (item.Value == "-framework") {
      // This is the first part of '-framework Name' where the framework
      // name is specified as a following item.  Ignore both.
      skipItemAfterFramework = true;
      continue;
    } else if (cmLinkItemValidForDevice(item.Value.Value)) {
      linkLib.Value = item.Value.Value;
    }

    if (emitted.insert(linkLib.Value).second) {
      linkLib.Value += " ";

      const cmLinkImplementation* linkImpl =
        cli.GetTarget()->GetLinkImplementation(
          cli.GetConfig(), cmGeneratorTarget::LinkInterfaceFor::Link);

      for (const cmLinkImplItem& iter : linkImpl->Libraries) {
        if (iter.Target != nullptr &&
            iter.Target->GetType() != cmStateEnums::INTERFACE_LIBRARY) {
          std::string libPath = iter.Target->GetLocation(cli.GetConfig());
          if (item.Value == libPath) {
            linkLib.Backtrace = iter.Backtrace;
            break;
          }
        }
      }

      linkLibraries.emplace_back(linkLib);
    }
  }

  if (!stdLibString.empty()) {
    linkLibraries.emplace_back(cmStrCat(stdLibString, ' '));
  }
}